

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

RESOURCE_STATE Diligent::VkAccessFlagsToResourceStates(VkAccessFlags AccessFlags)

{
  Uint32 BitPos;
  byte bVar1;
  RESOURCE_STATE RVar2;
  int iVar3;
  RESOURCE_STATE RVar4;
  anon_class_1_0_00000001 local_21;
  
  if ((VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState == '\0') &&
     (iVar3 = __cxa_guard_acquire(&VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState),
     iVar3 != 0)) {
    VkAccessFlagBitPosToResourceState::anon_class_1_0_00000001::operator()
              (&VkAccessFlagsToResourceStates::BitPosToState.FlagBitPosToResourceState,&local_21);
    __cxa_guard_release(&VkAccessFlagsToResourceStates(unsigned_int)::BitPosToState);
  }
  RVar4 = RESOURCE_STATE_UNKNOWN;
  if (AccessFlags != 0) {
    do {
      BitPos = 0;
      if (AccessFlags != 0) {
        for (; (AccessFlags >> BitPos & 1) == 0; BitPos = BitPos + 1) {
        }
      }
      RVar2 = VkAccessFlagBitPosToResourceState::operator()
                        (&VkAccessFlagsToResourceStates::BitPosToState,BitPos);
      RVar4 = RVar4 | RVar2;
      bVar1 = (byte)BitPos & 0x1f;
      AccessFlags = AccessFlags & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    } while (AccessFlags != 0);
  }
  return RVar4;
}

Assistant:

RESOURCE_STATE VkAccessFlagsToResourceStates(VkAccessFlags AccessFlags)
{
    static const VkAccessFlagBitPosToResourceState BitPosToState;
    Uint32                                         State = 0;
    while (AccessFlags != 0)
    {
        Uint32 lsb = PlatformMisc::GetLSB(AccessFlags);
        State |= BitPosToState(lsb);
        AccessFlags &= ~(1 << lsb);
    }
    return static_cast<RESOURCE_STATE>(State);
}